

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

StringType * __thiscall
ICM::Compiler::Literal::StringType::operator+=(StringType *this,StringType *st)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  allocator local_51;
  string s2;
  string s1;
  
  std::__cxx11::string::string((string *)&s1,this->data,(allocator *)&s2);
  std::__cxx11::string::string((string *)&s2,st->data,&local_51);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::operator+(__return_storage_ptr__,&s1,&s2);
  this->data = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  return this;
}

Assistant:

StringType& operator+=(const StringType& st) {
					string s1(data), s2(st.data);
					string *s = new string(s1 + s2); // TODO
					data = (char*)(s->c_str());      // TODO
					return *this;
				}